

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_10761d::JsonObject::JsonObject(JsonObject *this)

{
  JsonObject *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__JsonObject_0025b580;
  testing::StrictMock<mock_json_callbacks>::StrictMock(&this->callbacks_);
  callbacks_proxy<mock_json_callbacks>::callbacks_proxy
            (&this->proxy_,&(this->callbacks_).super_mock_json_callbacks);
  return;
}

Assistant:

JsonObject ()
                : proxy_{callbacks_} {}